

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen.c
# Opt level: O2

FILE * fopen(char *__filename,char *__modes)

{
  uint uVar1;
  _PDCLIB_fd_t _Var2;
  FILE *__ptr;
  char *pcVar3;
  
  uVar1 = _PDCLIB_filemode(__modes);
  if ((__filename != (char *)0x0 && uVar1 != 0) && (*__filename != '\0')) {
    __ptr = (FILE *)_PDCLIB_init_file_t((_PDCLIB_file_t *)0x0);
    if (__ptr == (FILE *)0x0) {
      return (FILE *)0x0;
    }
    uVar1 = uVar1 | *(uint *)((long)&__ptr->_IO_buf_end + 4) | 2;
    *(uint *)((long)&__ptr->_IO_buf_end + 4) = uVar1;
    _Var2 = _PDCLIB_open(__filename,uVar1);
    __ptr->_flags = _Var2;
    if (_Var2 != -1) {
      pcVar3 = _PDCLIB_realpath(__filename);
      *(char **)&__ptr->_fileno = pcVar3;
      mtx_lock(&_PDCLIB_filelist_mtx);
      __ptr->_old_offset = (__off_t)_PDCLIB_filelist;
      _PDCLIB_filelist = (_PDCLIB_file_t *)__ptr;
      mtx_unlock(&_PDCLIB_filelist_mtx);
      return __ptr;
    }
    mtx_destroy((_PDCLIB_mtx_t *)&__ptr->_IO_save_base);
    free(__ptr->_IO_read_ptr);
    free(__ptr);
  }
  return (FILE *)0x0;
}

Assistant:

struct _PDCLIB_file_t * fopen( const char * _PDCLIB_restrict filename, const char * _PDCLIB_restrict mode )
{
    struct _PDCLIB_file_t * rc;
    unsigned int filemode = _PDCLIB_filemode( mode );

    if ( filemode == 0 )
    {
        /* mode invalid */
        return NULL;
    }

    if ( filename == NULL || filename[0] == '\0' )
    {
        /* filename invalid */
        return NULL;
    }

    /* See tmpfile(), which does much of the same. */

    if ( ( rc = _PDCLIB_init_file_t( NULL ) ) == NULL )
    {
        /* initializing FILE structure failed */
        return NULL;
    }

    /* Setting buffer to _IOLBF because "when opened, a stream is fully
       buffered if and only if it can be determined not to refer to an
       interactive device."
    */
    rc->status |= filemode | _IOLBF;

    if ( ( rc->handle = _PDCLIB_open( filename, rc->status ) ) == _PDCLIB_NOHANDLE )
    {
        /* OS open() failed */
#ifndef __STDC_NO_THREADS__
        mtx_destroy( &rc->mtx );
#endif
        free( rc->buffer );
        free( rc );
        return NULL;
    }

    /* Getting absolute filename (for potential freopen()) */
    rc->filename = _PDCLIB_realpath( filename );

    /* Adding to list of open files */
    _PDCLIB_LOCK( _PDCLIB_filelist_mtx );
    rc->next = _PDCLIB_filelist;
    _PDCLIB_filelist = rc;
    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
    return rc;
}